

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBLAS
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CopyBLASAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"CopyBLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x7a4);
      std::__cxx11::string::~string((string *)&local_58);
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a4);
    std::__cxx11::string::~string((string *)&local_58);
    CVar2 = (this->m_Desc).QueueType;
    Type = extraout_DL;
  }
  if ((~CVar2 & 3) != 0) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[9],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)"CopyBLAS",(char (*) [9])0x65e20a,(char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_38);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a4);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((((this->m_pDevice).m_pObject)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.RayTracing ==
      DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[70]>
              (&local_58,
               (char (*) [70])
               "IDeviceContext::CopyBLAS: ray tracing is not supported by this device");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a5);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[74]>
              (&local_58,
               (char (*) [74])
               "IDeviceContext::CopyBLAS command must be performed outside of render pass");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a6);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar3 = VerifyCopyBLASAttribs((IRenderDevice *)(this->m_pDevice).m_pObject,Attribs);
  if (!bVar3) {
    FormatString<char[28]>(&local_58,(char (*) [28])"CopyBLASAttribs are invalid");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a7);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.CopyBLAS;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::CopyBLAS(const CopyBLASAttribs& Attribs, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "CopyBLAS");
    DEV_CHECK_ERR(m_pDevice->GetFeatures().RayTracing, "IDeviceContext::CopyBLAS: ray tracing is not supported by this device");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "IDeviceContext::CopyBLAS command must be performed outside of render pass");
    DEV_CHECK_ERR(VerifyCopyBLASAttribs(m_pDevice, Attribs), "CopyBLASAttribs are invalid");

    ++m_Stats.CommandCounters.CopyBLAS;
}